

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editcol.c
# Opt level: O2

int ffrsimll(fitsfile *fptr,int bitpix,int naxis,LONGLONG *naxes,int *status)

{
  fitsfile *fptr_00;
  undefined4 uVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong value;
  uint uVar8;
  ulong uVar9;
  int onaxis;
  ulong local_430;
  fitsfile *local_428;
  int obitpix;
  int local_41c;
  long gcount;
  long pcount;
  char comment [73];
  int extend;
  int simple;
  char keyname [75];
  LONGLONG onaxes [99];
  
  if (0 < *status) {
    return *status;
  }
  if (fptr->HDUposition == fptr->Fptr->curhdu) {
    if ((fptr->Fptr->datastart == -1) && (iVar2 = ffrdef(fptr,status), 0 < iVar2))
    goto LAB_0011e6c4;
  }
  else {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  iVar2 = ffghprll(fptr,99,&simple,&obitpix,&onaxis,onaxes,&pcount,&gcount,&extend,status);
  if (0 < iVar2) goto LAB_0011e6c4;
  if (bitpix == 10) {
    uVar9 = 8;
  }
  else if (bitpix == 0x14) {
    uVar9 = 0x10;
  }
  else if (bitpix == 0x28) {
    uVar9 = 0x20;
  }
  else {
    iVar2 = 0x40;
    if (bitpix != 0x50) {
      iVar2 = bitpix;
    }
    uVar9 = (ulong)iVar2;
    if ((((0x38 < iVar2 - 8U) || ((0x100000001000101U >> ((ulong)(iVar2 - 8U) & 0x3f) & 1) == 0)) &&
        (iVar2 != -0x40)) && (iVar2 != -0x20)) {
      snprintf(keyname,0x51,"Illegal value for BITPIX keyword: %d",bitpix);
      ffpmsg(keyname);
      *status = 0xd3;
      return 0xd3;
    }
  }
  if (999 < (uint)naxis) {
    snprintf(keyname,0x51,"Illegal value for NAXIS keyword: %d",(ulong)(uint)naxis);
    ffpmsg(keyname);
    *status = 0xd4;
    return 0xd4;
  }
  value = (ulong)(uint)naxis;
  uVar7 = (ulong)(naxis != 0);
  for (uVar4 = 0; value != uVar4; uVar4 = uVar4 + 1) {
    lVar5 = naxes[uVar4];
    if (lVar5 < 0) {
      snprintf(keyname,0x51,"Illegal value for NAXIS%d keyword: %.0f",SUB84((double)lVar5,0),
               (ulong)((int)uVar4 + 1));
      ffpmsg(keyname);
      *status = 0xd5;
      return 0xd5;
    }
    uVar7 = uVar7 * lVar5;
  }
  if (onaxis == 0) {
    lVar5 = 0;
  }
  else {
    uVar6 = 0;
    uVar4 = (ulong)(uint)onaxis;
    if (onaxis < 1) {
      uVar4 = uVar6;
    }
    lVar5 = 1;
    for (; uVar4 != uVar6; uVar6 = uVar6 + 1) {
      lVar5 = lVar5 * onaxes[uVar6];
    }
    uVar8 = -obitpix;
    if (0 < obitpix) {
      uVar8 = obitpix;
    }
    lVar5 = (long)((ulong)(uVar8 >> 3) * (lVar5 + pcount) * gcount + 0xb3f) / 0xb40;
  }
  uVar4 = -uVar9;
  if (0 < (long)uVar9) {
    uVar4 = uVar9;
  }
  lVar3 = (long)((uVar4 >> 3 & 0x1fffffff) * gcount * (pcount + uVar7) + 0xb3f) / 0xb40;
  if (lVar3 - lVar5 == 0 || lVar3 < lVar5) {
    if (lVar5 - lVar3 != 0 && lVar3 <= lVar5) {
      local_430 = uVar9;
      iVar2 = ffdblk(fptr,lVar5 - lVar3,status);
      goto LAB_0011e8d3;
    }
  }
  else {
    local_430 = uVar9;
    iVar2 = ffiblk(fptr,lVar3 - lVar5,1,status);
LAB_0011e8d3:
    uVar9 = local_430;
    if (0 < iVar2) goto LAB_0011e6c4;
  }
  comment[0] = '&';
  comment[1] = '\0';
  if (uVar9 != (long)obitpix) {
    ffmkyj(fptr,"BITPIX",uVar9,comment,status);
  }
  local_430 = CONCAT44(local_430._4_4_,naxis);
  local_428 = fptr;
  local_41c = bitpix;
  if (onaxis != naxis) {
    ffmkyj(fptr,"NAXIS",value,comment,status);
    naxis = onaxis;
  }
  if ((int)(uint)local_430 <= naxis) {
    naxis = (uint)local_430;
  }
  uVar9 = (ulong)(uint)naxis;
  if (naxis < 1) {
    uVar9 = 0;
  }
  uVar4 = 0;
  while (uVar9 != uVar4) {
    ffkeyn("NAXIS",(int)(uVar4 + 1),keyname,status);
    ffmkyj(local_428,keyname,naxes[uVar4],comment,status);
    uVar4 = uVar4 + 1;
  }
  if (onaxis < (int)(uint)local_430) {
    lVar5 = (long)onaxis;
    builtin_strncpy(comment,"length of data axis",0x14);
    iVar2 = onaxis;
    for (; iVar2 = iVar2 + 1, lVar5 < (long)value; lVar5 = lVar5 + 1) {
      ffkeyn("NAXIS",iVar2,keyname,status);
      ffikyj(local_428,keyname,naxes[lVar5],comment,status);
    }
  }
  else if ((int)(uint)local_430 < onaxis) {
    iVar2 = (uint)local_430;
    while (iVar2 < onaxis) {
      iVar2 = iVar2 + 1;
      ffkeyn("NAXIS",iVar2,keyname,status);
      ffdkey(local_428,keyname,status);
    }
  }
  fptr_00 = local_428;
  if (local_41c == 10) {
    builtin_strncpy(comment + 0x1c," signed byte",0xd);
    uVar8 = 0xc0600000;
LAB_0011eb39:
    builtin_strncpy(comment,"offset data range to that of",0x1c);
    ffukyg(local_428,"BZERO",(double)((ulong)uVar8 << 0x20),0,comment,status);
    uVar1 = comment._20_4_;
    builtin_strncpy(comment,"default scaling factor",0x17);
    comment[0x17] = SUB41(uVar1,3);
    ffukyg(fptr_00,"BSCALE",1.0,0,comment,status);
  }
  else {
    if (local_41c == 0x50) {
      builtin_strncpy(comment + 0x1c," unsigned long long",0x14);
      uVar8 = 0x43e00000;
      goto LAB_0011eb39;
    }
    if (local_41c == 0x28) {
      builtin_strncpy(comment + 0x1c," unsigned long",0xf);
      uVar8 = 0x41e00000;
      goto LAB_0011eb39;
    }
    if (local_41c == 0x14) {
      builtin_strncpy(comment + 0x1c," unsigned short",0x10);
      uVar8 = 0x40e00000;
      goto LAB_0011eb39;
    }
  }
  ffrdef(fptr_00,status);
LAB_0011e6c4:
  return *status;
}

Assistant:

int ffrsimll(fitsfile *fptr,    /* I - FITS file pointer           */
           int bitpix,          /* I - bits per pixel              */
           int naxis,           /* I - number of axes in the array */
           LONGLONG *naxes,     /* I - size of each axis           */
           int *status)         /* IO - error status               */
/*
   resize an existing primary array or IMAGE extension.
*/
{
    int ii, simple, obitpix, onaxis, extend, nmodify;
    long  nblocks, longval;
    long pcount, gcount, longbitpix;
    LONGLONG onaxes[99], newsize, oldsize;
    char comment[FLEN_COMMENT], keyname[FLEN_KEYWORD], message[FLEN_ERRMSG];

    if (*status > 0)
        return(*status);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
    {
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    }
         /* rescan header if data structure is undefined */
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)               
            return(*status);

    /* get current image size parameters */
    if (ffghprll(fptr, 99, &simple, &obitpix, &onaxis, onaxes, &pcount,
               &gcount, &extend, status) > 0)
        return(*status);

    longbitpix = bitpix;

    /* test for the 4 special cases that represent unsigned integers 
       or signed bytes */
    if (longbitpix == USHORT_IMG)
        longbitpix = SHORT_IMG;
    else if (longbitpix == ULONG_IMG)
        longbitpix = LONG_IMG;
    else if (longbitpix == SBYTE_IMG)
        longbitpix = BYTE_IMG;
    else if (longbitpix == ULONGLONG_IMG)
        longbitpix = LONGLONG_IMG;

    /* test that the new values are legal */

    if (longbitpix != BYTE_IMG && longbitpix != SHORT_IMG && 
        longbitpix != LONG_IMG && longbitpix != LONGLONG_IMG &&
        longbitpix != FLOAT_IMG && longbitpix != DOUBLE_IMG)
    {
        snprintf(message, FLEN_ERRMSG,
        "Illegal value for BITPIX keyword: %d", bitpix);
        ffpmsg(message);
        return(*status = BAD_BITPIX);
    }

    if (naxis < 0 || naxis > 999)
    {
        snprintf(message, FLEN_ERRMSG,
        "Illegal value for NAXIS keyword: %d", naxis);
        ffpmsg(message);
        return(*status = BAD_NAXIS);
    }

    if (naxis == 0)
        newsize = 0;
    else
        newsize = 1;

    for (ii = 0; ii < naxis; ii++)
    {
        if (naxes[ii] < 0)
        {
            snprintf(message, FLEN_ERRMSG,
            "Illegal value for NAXIS%d keyword: %.0f", ii + 1,  (double) (naxes[ii]));
            ffpmsg(message);
            return(*status = BAD_NAXES);
        }

        newsize *= naxes[ii];  /* compute new image size, in pixels */
    }

    /* compute size of old image, in bytes */

    if (onaxis == 0)
        oldsize = 0;
    else
    {
        oldsize = 1;
        for (ii = 0; ii < onaxis; ii++)
            oldsize *= onaxes[ii];  
        oldsize = (oldsize + pcount) * gcount * (abs(obitpix) / 8);
    }

    oldsize = (oldsize + 2879) / 2880; /* old size, in blocks */

    newsize = (newsize + pcount) * gcount * (labs(longbitpix) / 8);
    newsize = (newsize + 2879) / 2880; /* new size, in blocks */

    if (newsize > oldsize)   /* have to insert new blocks for image */
    {
        nblocks = (long) (newsize - oldsize);
        if (ffiblk(fptr, nblocks, 1, status) > 0)  
            return(*status);
    }
    else if (oldsize > newsize)  /* have to delete blocks from image */
    {
        nblocks = (long) (oldsize - newsize);
        if (ffdblk(fptr, nblocks, status) > 0)  
            return(*status);
    }

    /* now update the header keywords */

    strcpy(comment,"&");  /* special value to leave comments unchanged */

    if (longbitpix != obitpix)
    {                         /* update BITPIX value */
        ffmkyj(fptr, "BITPIX", longbitpix, comment, status);
    }

    if (naxis != onaxis)
    {                        /* update NAXIS value */
        longval = naxis;
        ffmkyj(fptr, "NAXIS", longval, comment, status);
    }

    /* modify the existing NAXISn keywords */
    nmodify = minvalue(naxis, onaxis); 
    for (ii = 0; ii < nmodify; ii++)
    {
        ffkeyn("NAXIS", ii+1, keyname, status);
        ffmkyj(fptr, keyname, naxes[ii], comment, status);
    }

    if (naxis > onaxis)  /* insert additional NAXISn keywords */
    {
        strcpy(comment,"length of data axis");  
        for (ii = onaxis; ii < naxis; ii++)
        {
            ffkeyn("NAXIS", ii+1, keyname, status);
            ffikyj(fptr, keyname, naxes[ii], comment, status);
        }
    }
    else if (onaxis > naxis) /* delete old NAXISn keywords */
    {
        for (ii = naxis; ii < onaxis; ii++)
        {
            ffkeyn("NAXIS", ii+1, keyname, status);
            ffdkey(fptr, keyname, status);
        }
    }

    /* Update the BSCALE and BZERO keywords, if an unsigned integer image
       or a signed byte image.  */
    if (bitpix == USHORT_IMG)
    {
        strcpy(comment, "offset data range to that of unsigned short");
        ffukyg(fptr, "BZERO", 32768., 0, comment, status);
        strcpy(comment, "default scaling factor");
        ffukyg(fptr, "BSCALE", 1.0, 0, comment, status);
    }
    else if (bitpix == ULONG_IMG)
    {
        strcpy(comment, "offset data range to that of unsigned long");
        ffukyg(fptr, "BZERO", 2147483648., 0, comment, status);
        strcpy(comment, "default scaling factor");
        ffukyg(fptr, "BSCALE", 1.0, 0, comment, status);
    }
    else if (bitpix == ULONGLONG_IMG)
    {
        strcpy(comment, "offset data range to that of unsigned long long");
        ffukyg(fptr, "BZERO", 9223372036854775808., 0, comment, status);
        strcpy(comment, "default scaling factor");
        ffukyg(fptr, "BSCALE", 1.0, 0, comment, status);
    }
    else if (bitpix == SBYTE_IMG)
    {
        strcpy(comment, "offset data range to that of signed byte");
        ffukyg(fptr, "BZERO", -128., 0, comment, status);
        strcpy(comment, "default scaling factor");
        ffukyg(fptr, "BSCALE", 1.0, 0, comment, status);
    }

    /* re-read the header, to make sure structures are updated */
    ffrdef(fptr, status);
    return(*status);
}